

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_uref(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  Reg rr;
  Reg rb;
  Reg rb_00;
  ushort *in_RSI;
  ASMState *in_RDI;
  Reg func;
  Reg uv;
  MRef *v;
  GCfunc *fn;
  Reg dest;
  RegSet in_stack_ffffffffffffffc8;
  IRRef in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int cc;
  ASMState *in_stack_ffffffffffffffe0;
  
  cc = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  rr = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (IRIns *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  if (*in_RSI < 0x8000) {
    emit_rma(in_RDI,XO_MOV,rr,
             (void *)((ulong)*(uint *)((ulong)in_RDI->ir[*in_RSI].field_1.op12 + 0x14 +
                                      (long)((int)(uint)in_RSI[1] >> 8) * 4) + 0x10));
  }
  else {
    rb = ra_scratch((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc);
    rb_00 = ra_alloc1((ASMState *)CONCAT44(rb,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                      in_stack_ffffffffffffffc8);
    if (*(char *)((long)in_RSI + 5) == '=') {
      emit_rmro(in_RDI,XO_LEA,rr,rb,8);
      asm_guardcc(in_stack_ffffffffffffffe0,cc);
      pMVar1 = in_RDI->mcp;
      in_RDI->mcp = pMVar1 + -1;
      pMVar1[-1] = '\x01';
      emit_rmro(in_RDI,XO_ARITHib,7,rb,6);
    }
    else {
      emit_rmro(in_RDI,XO_MOV,rr,rb,0x10);
    }
    emit_rmro(in_RDI,XO_MOV,rb,rb_00,((int)(uint)in_RSI[1] >> 8) * 4 + 0x14);
  }
  return;
}

Assistant:

static void asm_uref(ASMState *as, IRIns *ir)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  if (irref_isk(ir->op1)) {
    GCfunc *fn = ir_kfunc(IR(ir->op1));
    MRef *v = &gcref(fn->l.uvptr[(ir->op2 >> 8)])->uv.v;
    emit_rma(as, XO_MOV, dest|REX_GC64, v);
  } else {
    Reg uv = ra_scratch(as, RSET_GPR);
    Reg func = ra_alloc1(as, ir->op1, RSET_GPR);
    if (ir->o == IR_UREFC) {
      emit_rmro(as, XO_LEA, dest|REX_GC64, uv, offsetof(GCupval, tv));
      asm_guardcc(as, CC_NE);
      emit_i8(as, 1);
      emit_rmro(as, XO_ARITHib, XOg_CMP, uv, offsetof(GCupval, closed));
    } else {
      emit_rmro(as, XO_MOV, dest|REX_GC64, uv, offsetof(GCupval, v));
    }
    emit_rmro(as, XO_MOV, uv|REX_GC64, func,
	      (int32_t)offsetof(GCfuncL, uvptr) +
	      (int32_t)sizeof(MRef) * (int32_t)(ir->op2 >> 8));
  }
}